

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O3

bool __thiscall ON_FileIterator::NextItem(ON_FileIterator *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__file;
  wchar_t *pwVar5;
  undefined8 uVar6;
  wchar_t *current_name_ext;
  dirent *dp;
  ON_FileIterator *local_10f0;
  ON_FileIterator *local_10e8;
  ON_FileIterator *local_10e0;
  ON_String utf8buffer;
  ON_wString wpath;
  stat buf;
  wchar_t current_name [1024];
  
  ON_wString::operator=((ON_wString *)(this + 0x18),&ON_wString::EmptyString);
  ON_wString::operator=((ON_wString *)(this + 0x20),&ON_wString::EmptyString);
  if (*(int *)this == 2) {
    local_10e0 = this + 8;
    local_10f0 = this + 0x20;
    local_10e8 = this + 0x18;
    do {
      dp = (dirent *)0x0;
      iVar3 = readdir_r(*(DIR **)(*(long *)(this + 0x30) + 0x10),
                        (dirent *)(*(long *)(this + 0x30) + 0x18),(dirent **)&dp);
      if ((iVar3 != 0) || (dp == (dirent *)0x0)) goto LAB_0046f200;
      lVar1 = *(long *)(this + 0x30);
      if (*(char *)(lVar1 + 0x2b) == '.') {
        iVar3 = 3;
        if ((*(char *)(lVar1 + 0x2c) != '\0') &&
           ((*(char *)(lVar1 + 0x2c) != '.' || (*(char *)(lVar1 + 0x2d) != '\0'))))
        goto LAB_0046f020;
      }
      else {
        if (*(char *)(lVar1 + 0x2b) == '\0') goto LAB_0046f200;
LAB_0046f020:
        memset(current_name,0,0x1000);
        ON_ConvertUTF8ToWideChar
                  (0,(char *)(lVar1 + 0x2b),-1,current_name,0x3ff,(uint *)0x0,0x1c,0,(char **)0x0);
        ON_wString::ON_wString(&wpath,(ON_wString *)local_10e0);
        ON_wString::operator+=(&wpath,'/');
        ON_wString::operator+=(&wpath,current_name);
        ON_String::ON_String(&utf8buffer,&wpath);
        __file = ON_String::operator_cast_to_char_(&utf8buffer);
        if (__file == (char *)0x0) {
          iVar3 = 3;
        }
        else {
          memset(&buf,0,0x90);
          iVar4 = stat(__file,(stat *)&buf);
          iVar3 = 3;
          if (iVar4 == 0) {
            if ((buf.st_mode & 0xf000) == 0x4000) {
              uVar6 = 2;
LAB_0046f12d:
              memcpy((void *)(*(long *)(this + 0x30) + 0x230),current_name,0x1000);
              lVar1 = *(long *)(this + 0x30);
              *(undefined8 *)(lVar1 + 0x1230) = uVar6;
              *(__off_t *)(lVar1 + 0x1238) = buf.st_size;
              *(__time_t *)(lVar1 + 0x1240) = buf.st_mtim.tv_sec;
              ON_wString::operator=((ON_wString *)local_10e8,(wchar_t *)(lVar1 + 0x230));
              iVar3 = 1;
              ON_wString::operator=((ON_wString *)local_10f0,&ON_wString::EmptyString);
            }
            else if ((buf.st_mode & 0xf000) == 0x8000) {
              pwVar5 = ON_wString::operator_cast_to_wchar_t_(*(ON_wString **)(this + 0x30));
              if ((((pwVar5 == (wchar_t *)0x0) || (*pwVar5 != L'*')) || (pwVar5[1] != L'.')) ||
                 ((pwVar5[2] == L'\0' || (pwVar5[2] == L'*')))) {
                uVar6 = 1;
                goto LAB_0046f12d;
              }
              current_name_ext = (wchar_t *)0x0;
              on_wsplitpath(current_name,(wchar_t **)0x0,(wchar_t **)0x0,(wchar_t **)0x0,
                            &current_name_ext);
              if (current_name_ext != (wchar_t *)0x0) {
                iVar4 = wcscmp(pwVar5 + 1,current_name_ext);
                uVar6 = 1;
                if (iVar4 == 0) goto LAB_0046f12d;
              }
            }
          }
        }
        ON_String::~ON_String(&utf8buffer);
        ON_wString::~ON_wString(&wpath);
      }
    } while (iVar3 == 3);
    if (iVar3 != 2) {
      return true;
    }
LAB_0046f200:
    uVar6 = *(undefined8 *)(this + 0x28);
    Reset(this);
    *(undefined8 *)(this + 0x28) = uVar6;
    *(undefined4 *)this = 3;
  }
  else if (*(int *)this == 1) {
    bVar2 = FirstItem(this);
    return bVar2;
  }
  return false;
}

Assistant:

bool ON_FileIterator::NextItem()
{
  m_item_name = ON_wString::EmptyString;
  m_full_path_name = ON_wString::EmptyString;
  if ( 1 == m_state )
    return FirstItem();
  if ( 2 != m_state )
    return false;

#if defined(ON_COMPILER_MSC)
  for (;;)
  {
    if (0 == m_impl->m_h || INVALID_HANDLE_VALUE == m_impl->m_h || 0 == m_impl->m_fd.cFileName[0])
    {
      break;
    }

    for (;;)
    {
      if (!::FindNextFile(m_impl->m_h, &m_impl->m_fd) || 0 == m_impl->m_fd.cFileName[0])
        break;

      if (IsDotOrDotDotDir(m_impl->m_fd.cFileName))
        continue;

      m_count++;
      m_impl->m_fd.cFileName[(sizeof(m_impl->m_fd.cFileName) / sizeof(m_impl->m_fd.cFileName[0])) - 1] = 0;
      m_item_name = m_impl->m_fd.cFileName;
      m_full_path_name = ON_wString::EmptyString;
      return true;
    }

    break;
  }
#else

  // gcc code
  ON__UINT64 current_file_attributes = 0;
  wchar_t current_name[ sizeof(m_impl->m_current_name)/sizeof(m_impl->m_current_name[0]) ];
  for(;;)
  {
    current_file_attributes = 0;
    struct dirent* dp = 0;
    int readdir_errno = readdir_r(m_impl->m_dir, &m_impl->m_dirent, &dp);
    if ( 0 !=  readdir_errno )
      break;
    if ( 0 == dp )
      break;
    if ( 0 == m_impl->m_dirent.d_name[0] )
      break;

    if ( IsDotOrDotDotDir(m_impl->m_dirent.d_name) )
      continue;

    memset( current_name, 0, sizeof(current_name) );
    ON_ConvertUTF8ToWideChar(
      false, // no BOM in input file name as utf8 string
      &m_impl->m_dirent.d_name[0],
      -1, // null terminated utf8 string
      &current_name[0], ((int)(sizeof(current_name)/sizeof(current_name[0]))) - 1, // output wchar_t string
      0, // null output error status
      (4|8|16), // mask common conversion errors
      0, // error_code_point = null terminator inserted at point of conversion error
      0  // null ouput end-of-string pointer
      );
    // TODO
    //   Test m_dirent.d_name to make sure it passes m_ws/utf8_file_name_filter

    ON_wString wpath = m_directory;
    wpath += '/';
    wpath += current_name;

    // get a utf8 version of the full path to pass to stat
    const ON_String utf8buffer(wpath);
    const char* utf8path = utf8buffer;
    if ( 0 == utf8path )
      continue;

    struct stat buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = stat( utf8path, &buf);
    if ( 0 != stat_errno )
      continue;

    if ( S_ISDIR(buf.st_mode) )
    {
      current_file_attributes = 2;
    }
    else if ( S_ISREG(buf.st_mode) )
    {
      // Only *.ext filters work at this time for non-windows
      const wchar_t* file_name_filter = m_impl->m_ws_file_name_filter;
      if (   0 != file_name_filter
            && '*' == file_name_filter[0] 
            && '.' == file_name_filter[1]
            && 0 != file_name_filter[2]
            && '*' != file_name_filter[2] )
      {
        // assume this is a *.extension filter
        const wchar_t* current_name_ext = 0;
        on_wsplitpath(current_name,0,0,0,&current_name_ext);
        if (   0 == current_name_ext 
            || 0 != wcscmp(file_name_filter+1,current_name_ext) 
           )
        {
          // current_name does pass match file_name_filter
          continue;
        }
      }
      current_file_attributes = 1;
    }
    else
      continue;

    // save current item information
    memcpy( m_impl->m_current_name, current_name, sizeof(m_impl->m_current_name) );
    m_impl->m_current_file_attributes = current_file_attributes;
    m_impl->m_current_file_size = buf.st_size;
    m_impl->m_current_content_last_modified_time = buf.st_mtime;

    m_item_name = m_impl->m_current_name;
    m_full_path_name = ON_wString::EmptyString;
    return true;
  }

#endif
  const ON__UINT64 saved_count = m_count;
  Reset();
  m_count = saved_count;
  m_state = 3;
  return false;
}